

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void cs::foreach_helper<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>,cs_impl::any>
               (context_t *context,string *iterator,var *obj,
               deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body)

{
  element_type *peVar1;
  _Elt_pointer ppsVar2;
  statement_base *psVar3;
  bool bVar4;
  undefined *puVar5;
  _List_node_base *p_Var6;
  _Map_pointer pppsVar7;
  _Elt_pointer ppsVar8;
  int iVar9;
  _List_node_base *p_Var10;
  _Elt_pointer ppsVar11;
  scope_guard scope;
  scope_guard local_b8;
  _List_node_base *local_b0;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *local_a8;
  string *local_a0;
  _List_node_base *local_98;
  
  local_a0 = iterator;
  p_Var6 = (_List_node_base *)
           cs_impl::any::const_val<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>>
                     (obj);
  if ((((_List_base<cs_impl::any,_std::allocator<cs_impl::any>_> *)&p_Var6->_M_next)->_M_impl).
      _M_node.super__List_node_base._M_next != p_Var6) {
    peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1->break_block == true) {
      peVar1->break_block = false;
    }
    if (peVar1->continue_block == true) {
      peVar1->continue_block = false;
    }
    local_b8.context = context;
    domain_manager::add_domain(&(peVar1->super_runtime_type).storage);
    p_Var6 = (_List_node_base *)
             cs_impl::any::const_val<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>>
                       (obj);
    p_Var10 = p_Var6;
    local_b0 = p_Var6;
    local_a8 = body;
    do {
      puVar5 = current_process;
      p_Var10 = (((_List_base<cs_impl::any,_std::allocator<cs_impl::any>_> *)&p_Var10->_M_next)->
                _M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var10 == p_Var6) break;
      if ((*current_process & 1) != 0) {
        LOCK();
        *current_process = 0;
        UNLOCK();
        event_type::touch((event_type *)(puVar5 + 0xd0),(void *)0x0);
      }
      domain_manager::add_var_no_return<std::__cxx11::string_const&>
                (&(((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->instance).
                    super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_runtime_type).storage,local_a0,(var *)(p_Var10 + 1));
      ppsVar11 = (body->
                 super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_cur;
      ppsVar2 = (body->
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      local_98 = p_Var10;
      if (ppsVar11 != ppsVar2) {
        ppsVar8 = (body->
                  super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_start._M_last;
        pppsVar7 = (body->
                   super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          puVar5 = current_process;
          psVar3 = *ppsVar11;
          if ((*current_process & 1) != 0) {
            LOCK();
            *current_process = 0;
            UNLOCK();
            event_type::touch((event_type *)(puVar5 + 0xd0),(void *)0x0);
          }
          (*psVar3->_vptr_statement_base[3])(psVar3);
          peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->instance).
                   super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          iVar9 = 1;
          if (peVar1->return_fcall == false) {
            if (peVar1->break_block == true) {
              peVar1->break_block = false;
              goto LAB_002b0ae6;
            }
            if (peVar1->continue_block == true) {
              peVar1->continue_block = false;
              iVar9 = 4;
              goto LAB_002b0ae6;
            }
            iVar9 = 0;
            bVar4 = true;
          }
          else {
LAB_002b0ae6:
            bVar4 = false;
          }
          if (!bVar4) goto LAB_002b0b1c;
          ppsVar11 = ppsVar11 + 1;
          if (ppsVar11 == ppsVar8) {
            ppsVar11 = pppsVar7[1];
            pppsVar7 = pppsVar7 + 1;
            ppsVar8 = ppsVar11 + 0x40;
          }
        } while (ppsVar11 != ppsVar2);
      }
      iVar9 = 4;
LAB_002b0b1c:
      p_Var10 = local_98;
      body = local_a8;
      p_Var6 = local_b0;
      if (iVar9 == 4) {
        iVar9 = 0;
        domain_manager::next_domain
                  (&((((((local_b8.context)->
                        super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                      instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_runtime_type).storage);
      }
    } while (iVar9 == 0);
    scope_guard::~scope_guard(&local_b8);
  }
  return;
}

Assistant:

void foreach_helper(const context_t &context, const string &iterator, const var &obj,
	                    std::deque<statement_base *> &body)
	{
		if (obj.const_val<T>().empty())
			return;
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		for (const X &it: obj.const_val<T>()) {
			current_process->poll_event();
			context->instance->storage.add_var_no_return(iterator, it);
			for (auto &ptr: body) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}